

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void hermite_probabilist_set(int n,double *x,double *w)

{
  ostream *poVar1;
  double *w_local;
  double *x_local;
  int n_local;
  
  if (n == 1) {
    *x = 0.0;
    *w = 1.0;
  }
  else if (n == 2) {
    *x = -1.0;
    x[1] = 1.0;
    *w = 0.5;
    w[1] = 0.5;
  }
  else if (n == 3) {
    *x = -1.7320508075688772;
    x[1] = 0.0;
    x[2] = 1.7320508075688772;
    *w = 0.16666666666666666;
    w[1] = 0.6666666666666666;
    w[2] = 0.16666666666666666;
  }
  else if (n == 4) {
    *x = -2.3344142183389773;
    x[1] = -0.7419637843027258;
    x[2] = 0.7419637843027258;
    x[3] = 2.3344142183389773;
    *w = 0.04587585476806849;
    w[1] = 0.4541241452319315;
    w[2] = 0.4541241452319315;
    w[3] = 0.04587585476806849;
  }
  else if (n == 5) {
    *x = -2.8569700138728056;
    x[1] = -1.355626179974266;
    x[2] = 0.0;
    x[3] = 1.355626179974266;
    x[4] = 2.8569700138728056;
    *w = 0.01125741132772069;
    w[1] = 0.22207592200561266;
    w[2] = 0.5333333333333333;
    w[3] = 0.22207592200561266;
    w[4] = 0.01125741132772069;
  }
  else if (n == 6) {
    *x = -3.324257433552119;
    x[1] = -1.8891758777537107;
    x[2] = -0.6167065901925941;
    x[3] = 0.6167065901925941;
    x[4] = 1.8891758777537107;
    x[5] = 3.324257433552119;
    *w = 0.0025557844020562465;
    w[1] = 0.08861574604191452;
    w[2] = 0.40882846955602925;
    w[3] = 0.40882846955602925;
    w[4] = 0.08861574604191452;
    w[5] = 0.0025557844020562465;
  }
  else if (n == 7) {
    *x = -3.7504397177257425;
    x[1] = -2.366759410734541;
    x[2] = -1.1544053947399682;
    x[3] = 0.0;
    x[4] = 1.1544053947399682;
    x[5] = 2.366759410734541;
    x[6] = 3.7504397177257425;
    *w = 0.0005482688559722178;
    w[1] = 0.030757123967586498;
    w[2] = 0.24012317860501273;
    w[3] = 0.45714285714285713;
    w[4] = 0.24012317860501273;
    w[5] = 0.030757123967586498;
    w[6] = 0.0005482688559722178;
  }
  else if (n == 8) {
    *x = -4.1445471861258945;
    x[1] = -2.8024858612875416;
    x[2] = -1.636519042435108;
    x[3] = -0.5390798113513751;
    x[4] = 0.5390798113513751;
    x[5] = 1.636519042435108;
    x[6] = 2.8024858612875416;
    x[7] = 4.1445471861258945;
    *w = 0.00011261453837536777;
    w[1] = 0.009635220120788266;
    w[2] = 0.11723990766175901;
    w[3] = 0.37301225767907736;
    w[4] = 0.37301225767907736;
    w[5] = 0.11723990766175901;
    w[6] = 0.009635220120788266;
    w[7] = 0.00011261453837536777;
  }
  else if (n == 9) {
    *x = -4.512745863399783;
    x[1] = -3.20542900285647;
    x[2] = -2.07684797867783;
    x[3] = -1.0232556637891326;
    x[4] = 0.0;
    x[5] = 1.0232556637891326;
    x[6] = 2.07684797867783;
    x[7] = 3.20542900285647;
    x[8] = 4.512745863399783;
    *w = 2.2345844007746583e-05;
    w[1] = 0.002789141321231769;
    w[2] = 0.04991640676521787;
    w[3] = 0.24409750289493945;
    w[4] = 0.40634920634920635;
    w[5] = 0.24409750289493945;
    w[6] = 0.04991640676521787;
    w[7] = 0.002789141321231769;
    w[8] = 2.2345844007746583e-05;
  }
  else {
    if (n != 10) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"HERMITE_PROBABILIST_SET - Fatal error!\n");
      poVar1 = std::operator<<((ostream *)&std::cerr,"  Illegal value of N = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
      std::operator<<(poVar1,"\n");
      std::operator<<((ostream *)&std::cerr,"  Legal values are 1 to 10.\n");
      exit(1);
    }
    *x = -4.859462828332312;
    x[1] = -3.581823483551927;
    x[2] = -2.4843258416389546;
    x[3] = -1.4659890943911582;
    x[4] = -0.48493570751549764;
    x[5] = 0.48493570751549764;
    x[6] = 1.4659890943911582;
    x[7] = 2.4843258416389546;
    x[8] = 3.581823483551927;
    x[9] = 4.859462828332312;
    *w = 4.310652630718287e-06;
    w[1] = 0.0007580709343122177;
    w[2] = 0.019111580500770286;
    w[3] = 0.13548370298026774;
    w[4] = 0.34464233493201907;
    w[5] = 0.34464233493201907;
    w[6] = 0.13548370298026774;
    w[7] = 0.019111580500770286;
    w[8] = 0.0007580709343122177;
    w[9] = 4.310652630718287e-06;
  }
  return;
}

Assistant:

void hermite_probabilist_set ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    HERMITE_PROBABILIST_SET: probabilist Hermite quadrature.
//
//  Discussion:
//
//    The integral:
//
//      integral ( -oo < x < +oo ) f(x) * rho(x) dx
//
//    The weight:
//
//      rho(x) = exp ( - x * x / 2 ) / sqrt ( 2 * pi ) dx
//
//    The quadrature rule:
//
//      sum ( 1 <= i <= n ) w(i) * f ( x(i) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    07 June 2013
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Stephen Wolfram,
//    The Mathematica Book,
//    Fourth Edition,
//    Cambridge University Press, 1999,
//    ISBN: 0-521-64314-7,
//    LC: QA76.95.W65.
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  if ( n == 1 )
  {
    x[0] = 0.0;

    w[0] = 1.00000000000000000000000000000;
  }
  else if ( n == 2 )
  {
    x[0] = -1.00000000000000000000000000000;
    x[1] = +1.00000000000000000000000000000;

    w[0] = 0.50000000000000000000000000000;
    w[1] = 0.50000000000000000000000000000;
  }
  else if ( n == 3 )
  {
    x[0] = -1.73205080756887729352744634151;
    x[1] =  0.0;
    x[2] = +1.73205080756887729352744634151;

    w[0] = 0.166666666666666666666666666667;
    w[1] = 0.666666666666666666666666666667;
    w[2] = 0.166666666666666666666666666667;
  }
  else if ( n == 4 )
  {
    x[0] = -2.33441421833897723931751226721;
    x[1] = -0.741963784302725857648513596726;
    x[2] = +0.741963784302725857648513596726;
    x[3] = +2.33441421833897723931751226721;

    w[0] = 0.0458758547680684918168929937745;
    w[1] = 0.454124145231931508183107006225;
    w[2] = 0.454124145231931508183107006225;
    w[3] = 0.0458758547680684918168929937745;
  }
  else if ( n == 5 )
  {
    x[0] = -2.85697001387280565416230426401;
    x[1] = -1.35562617997426586583052129087;
    x[2] =  0.0;
    x[3] = +1.35562617997426586583052129087;
    x[4] = +2.85697001387280565416230426401;

    w[0] = 0.0112574113277206889333702151856;
    w[1] = 0.222075922005612644399963118148;
    w[2] = 0.533333333333333333333333333333;
    w[3] = 0.222075922005612644399963118148;
    w[4] = 0.0112574113277206889333702151856;
  }
  else if ( n == 6 )
  {
    x[0] = -3.32425743355211895236183546247;
    x[1] = -1.88917587775371067550566789858;
    x[2] = -0.616706590192594152193686099399;
    x[3] = +0.616706590192594152193686099399;
    x[4] = +1.88917587775371067550566789858;
    x[5] = +3.32425743355211895236183546247;

    w[0] = 0.00255578440205624643060629074383;
    w[1] = 0.0886157460419145274808558830057;
    w[2] = 0.40882846955602922608853782625;
    w[3] = 0.40882846955602922608853782625;
    w[4] = 0.0886157460419145274808558830057;
    w[5] = 0.00255578440205624643060629074383;
  }
  else if ( n == 7 )
  {
    x[0] = -3.75043971772574225630392202571;
    x[1] = -2.36675941073454128861885646856;
    x[2] = -1.15440539473996812723959775884;
    x[3] =  0.0;
    x[4] = +1.15440539473996812723959775884;
    x[5] = +2.36675941073454128861885646856;
    x[6] = +3.75043971772574225630392202571;

    w[0] = 0.000548268855972217791621570532802;
    w[1] = 0.0307571239675864970396450057164;
    w[2] = 0.240123178605012713740161995179;
    w[3] = 0.457142857142857142857142857143;
    w[4] = 0.240123178605012713740161995179;
    w[5] = 0.0307571239675864970396450057164;
    w[6] = 0.000548268855972217791621570532802;
  }
  else if ( n == 8 )
  {
    x[0] = -4.14454718612589433206019783917;
    x[1] = -2.80248586128754169911301080618;
    x[2] = -1.63651904243510799922544657297;
    x[3] = -0.539079811351375108072461918694;
    x[4] = +0.539079811351375108072461918694;
    x[5] = +1.63651904243510799922544657297;
    x[6] = +2.80248586128754169911301080618;
    x[7] = +4.14454718612589433206019783917;

    w[0] = 0.00011261453837536777039380201687;
    w[1] = 0.00963522012078826718691913771988;
    w[2] = 0.117239907661759015117137525962;
    w[3] = 0.373012257679077349925549534301;
    w[4] = 0.373012257679077349925549534301;
    w[5] = 0.117239907661759015117137525962;
    w[6] = 0.00963522012078826718691913771988;
    w[7] = 0.00011261453837536777039380201687;
  }
  else if ( n == 9 )
  {
    x[0] = -4.51274586339978266756667884317;
    x[1] = -3.20542900285646994336567590292;
    x[2] = -2.07684797867783010652215614374;
    x[3] = -1.02325566378913252482814822581;
    x[4] =  0.0;
    x[5] = +1.02325566378913252482814822581;
    x[6] = +2.07684797867783010652215614374;
    x[7] = +3.20542900285646994336567590292;
    x[8] = +4.51274586339978266756667884317;

    w[0] = 0.0000223458440077465836484639907118;
    w[1] = 0.00278914132123176862881344575164;
    w[2] = 0.0499164067652178740433414693826;
    w[3] = 0.2440975028949394361410220177;
    w[4] = 0.406349206349206349206349206349;
    w[5] = 0.2440975028949394361410220177;
    w[6] = 0.0499164067652178740433414693826;
    w[7] = 0.00278914132123176862881344575164;
    w[8] = 0.0000223458440077465836484639907118;
  }
  else if ( n == 10 )
  {
    x[0] =  -4.85946282833231215015516494660;
    x[1] =  -3.58182348355192692277623675546;
    x[2] =  -2.48432584163895458087625118368;
    x[3] =  -1.46598909439115818325066466416;
    x[4] =  -0.484935707515497653046233483105;
    x[5] =  +0.484935707515497653046233483105;
    x[6] =  +1.46598909439115818325066466416;
    x[7] =  +2.48432584163895458087625118368;
    x[8] =  +3.58182348355192692277623675546;
    x[9] =  +4.85946282833231215015516494660;

    w[0] =  0.0000043106526307182867322209547262;
    w[1] =  0.000758070934312217670069636036508;
    w[2] =  0.0191115805007702856047383687629;
    w[3] =  0.135483702980267735563431657727;
    w[4] =  0.344642334932019042875028116518;
    w[5] =  0.344642334932019042875028116518;
    w[6] =  0.135483702980267735563431657727;
    w[7] =  0.0191115805007702856047383687629;
    w[8] =  0.000758070934312217670069636036508;
    w[9] =  0.0000043106526307182867322209547262;
  }
  else
  {
    std::cerr << "\n";
    std::cerr << "HERMITE_PROBABILIST_SET - Fatal error!\n";
    std::cerr << "  Illegal value of N = " << n << "\n";
    std::cerr << "  Legal values are 1 to 10.\n";
    exit ( 1 );
  }

  return;
}